

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommDummy.cpp
# Opt level: O1

Comm adios2::helper::CommDummy(void)

{
  unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_> in_RDI;
  __uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_> local_10
  ;
  
  local_10._M_t.
  super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
  .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl =
       (tuple<adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>)
       operator_new(8);
  *(undefined ***)
   local_10._M_t.
   super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
   .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl =
       &PTR__CommImplDummy_0087cfb0;
  CommImpl::MakeComm((CommImpl *)
                     in_RDI._M_t.
                     super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
                     .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl,
                     (unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
                      *)&local_10);
  if ((_Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>)
      local_10._M_t.
      super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
      .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl != (CommImpl *)0x0) {
    (**(code **)(*(long *)local_10._M_t.
                          super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
                          .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl + 8
                ))();
  }
  return (unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>)
         (unique_ptr<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
         .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
}

Assistant:

Comm CommDummy()
{
    auto comm = std::unique_ptr<CommImpl>(new CommImplDummy());
    return CommImpl::MakeComm(std::move(comm));
}